

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_CURSE(effect_handler_context_t *context)

{
  byte bVar1;
  _Bool _Var2;
  char **local_60;
  char *passed_note;
  char note [32];
  _Bool local_29;
  _Bool display_dam;
  _Bool dead;
  monster *pmStack_28;
  _Bool fear;
  monster *mon;
  effect_handler_context_t *peStack_18;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  peStack_18 = context;
  mon._4_4_ = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  pmStack_28 = target_get_monster();
  local_29 = false;
  bVar1 = (player->opts).opt[3] & 1;
  peStack_18->ident = true;
  if (pmStack_28 == (monster *)0x0) {
    msg("No monster selected!");
    context_local._7_1_ = false;
  }
  else {
    if (bVar1 == 0) {
      local_60 = (char **)0x29913f;
    }
    else {
      strnfmt((char *)&passed_note,0x20," dies! (%d)",(ulong)(uint)mon._4_4_);
      local_60 = &passed_note;
    }
    _Var2 = mon_take_hit(pmStack_28,player,mon._4_4_,&local_29,(char *)local_60);
    if ((!_Var2) && (_Var2 = monster_is_visible(pmStack_28), _Var2)) {
      if (bVar1 == 0) {
        message_pain(pmStack_28,mon._4_4_);
      }
      else {
        message_pain_show_damage(pmStack_28,mon._4_4_);
      }
      if ((local_29 & 1U) != 0) {
        add_monster_message(pmStack_28,L'%',true);
      }
    }
    context_local._7_1_ = true;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_CURSE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	struct monster *mon = target_get_monster();
	bool fear = false;
	bool dead = false;
	bool display_dam = OPT(player, show_damage);
	char note[32];
	const char *passed_note;

	context->ident = true;

	/* Need to choose a monster, not just point */
	if (!mon) {
		msg("No monster selected!");
		return false;
	}

	/* Hit it */
	if (display_dam) {
		strnfmt(note, sizeof(note), " dies! (%d)", dam);
		passed_note = note;
	} else {
		passed_note = " dies!";
	}
	dead = mon_take_hit(mon, player, dam, &fear, passed_note);

	/* Handle fear for surviving monsters */
	if (!dead && monster_is_visible(mon)) {
		if (display_dam) {
			message_pain_show_damage(mon, dam);
		} else {
			message_pain(mon, dam);
		}
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}